

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lha_read_data_none(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  uint16_t uVar1;
  void *pvVar2;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  archive *in_RDI;
  ssize_t bytes_avail;
  lha *lha;
  archive_vtable_conflict *in_stack_ffffffffffffffc8;
  archive_read *a_00;
  wchar_t local_4;
  
  a_00 = *(archive_read **)in_RDI[0x15].archive_format_name;
  if ((a_00->archive).vtable == (archive_vtable_conflict *)0x0) {
    *in_RSI = 0;
    *in_RDX = 0;
    *in_RCX = *(undefined8 *)&a_00->archive;
    *(undefined1 *)((long)&a_00->bidders[0].init + 4) = 1;
    local_4 = L'\0';
  }
  else {
    pvVar2 = __archive_read_ahead(a_00,(size_t)in_stack_ffffffffffffffc8,(ssize_t *)0x13f3cb);
    *in_RSI = pvVar2;
    if ((long)in_stack_ffffffffffffffc8 < 1) {
      archive_set_error(in_RDI,0x54,"Truncated LHa file data");
      local_4 = L'\xffffffe2';
    }
    else {
      if ((long)(a_00->archive).vtable < (long)in_stack_ffffffffffffffc8) {
        in_stack_ffffffffffffffc8 = (a_00->archive).vtable;
      }
      uVar1 = lha_crc16(*(uint16_t *)&(a_00->archive).archive_format_name,(void *)*in_RSI,
                        (size_t)in_stack_ffffffffffffffc8);
      *(uint16_t *)&(a_00->archive).archive_format_name = uVar1;
      *in_RDX = in_stack_ffffffffffffffc8;
      *in_RCX = *(undefined8 *)&a_00->archive;
      *(long *)&a_00->archive =
           (long)&in_stack_ffffffffffffffc8->archive_close + *(long *)&a_00->archive;
      (a_00->archive).vtable =
           (archive_vtable_conflict *)
           ((long)(a_00->archive).vtable - (long)in_stack_ffffffffffffffc8);
      if ((a_00->archive).vtable == (archive_vtable_conflict *)0x0) {
        *(undefined1 *)((long)&a_00->bidders[0].init + 4) = 1;
      }
      *(archive_vtable_conflict **)&(a_00->archive).archive_format = in_stack_ffffffffffffffc8;
      local_4 = L'\0';
    }
  }
  return local_4;
}

Assistant:

static int
lha_read_data_none(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct lha *lha = (struct lha *)(a->format->data);
	ssize_t bytes_avail;

	if (lha->entry_bytes_remaining == 0) {
		*buff = NULL;
		*size = 0;
		*offset = lha->entry_offset;
		lha->end_of_entry = 1;
		return (ARCHIVE_OK);
	}
	/*
	 * Note: '1' here is a performance optimization.
	 * Recall that the decompression layer returns a count of
	 * available bytes; asking for more than that forces the
	 * decompressor to combine reads by copying data.
	 */
	*buff = __archive_read_ahead(a, 1, &bytes_avail);
	if (bytes_avail <= 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated LHa file data");
		return (ARCHIVE_FATAL);
	}
	if (bytes_avail > lha->entry_bytes_remaining)
		bytes_avail = (ssize_t)lha->entry_bytes_remaining;
	lha->entry_crc_calculated =
	    lha_crc16(lha->entry_crc_calculated, *buff, bytes_avail);
	*size = bytes_avail;
	*offset = lha->entry_offset;
	lha->entry_offset += bytes_avail;
	lha->entry_bytes_remaining -= bytes_avail;
	if (lha->entry_bytes_remaining == 0)
		lha->end_of_entry = 1;
	lha->entry_unconsumed = bytes_avail;
	return (ARCHIVE_OK);
}